

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

Vec_Int_t * Gia_MiniAigProcessFile(void)

{
  int Entry;
  Vec_Int_t *p;
  FILE *__stream;
  char *pcVar1;
  int nLinesAll;
  uint uVar2;
  int nLines;
  uint uVar3;
  char Buffer [1000];
  
  p = Vec_IntAlloc(100);
  __stream = fopen("test.txt","rb");
  if (__stream == (FILE *)0x0) {
    puts("Cannot open the file.");
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
    while( true ) {
      pcVar1 = fgets(Buffer,1000,__stream);
      if (pcVar1 == (char *)0x0) break;
      uVar2 = uVar2 + 1;
      if (Buffer[0] == '#') {
        pcVar1 = Buffer + 3;
        while( true ) {
          pcVar1 = strtok(pcVar1," \r\n\r+=");
          if (pcVar1 == (char *)0x0) break;
          Entry = atoi(pcVar1);
          Vec_IntPush(p,Entry);
          pcVar1 = (char *)0x0;
        }
        uVar3 = uVar3 + 1;
      }
    }
    fclose(__stream);
    printf("Collected %d (out of %d) lines.\n",(ulong)uVar3,(ulong)uVar2);
    printf("Entries = %d\n",(ulong)(uint)p->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_MiniAigProcessFile()
{
    Vec_Int_t * vTriples = Vec_IntAlloc( 100 );
    char * pFileName = "test.txt";
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
        printf( "Cannot open the file.\n" );
    else
    {
        int nLines = 0, nLinesAll = 0;
        char * pToken;
        char Buffer[1000];
        while ( fgets( Buffer, 1000, pFile ) != NULL )
        {
            nLinesAll++;
            if ( Buffer[0] != '#' )
                continue;
            //printf( "%s", Buffer );
            nLines++;
            pToken = strtok( Buffer+3, " \r\n\r+=" );
            while ( pToken )
            {
                Vec_IntPush( vTriples, atoi(pToken) );
                pToken = strtok( NULL, " \r\n\r+=" );
            }
        }
        fclose( pFile );
        printf( "Collected %d (out of %d) lines.\n", nLines, nLinesAll );
        printf( "Entries = %d\n", Vec_IntSize(vTriples) );
    }
    return vTriples;
}